

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall DSectorPlaneInterpolation::UpdateInterpolation(DSectorPlaneInterpolation *this)

{
  sector_t *psVar1;
  secplane_t *psVar2;
  splane *psVar3;
  bool bVar4;
  
  psVar1 = this->sector;
  bVar4 = this->ceiling != false;
  psVar2 = &psVar1->floorplane;
  if (bVar4) {
    psVar2 = &psVar1->ceilingplane;
  }
  this->oldheight = psVar2->D;
  psVar3 = psVar1->planes + 1;
  if (!bVar4) {
    psVar3 = psVar1->planes;
  }
  this->oldtexz = psVar3->TexZ;
  return;
}

Assistant:

void DSectorPlaneInterpolation::UpdateInterpolation()
{
	if (!ceiling)
	{
		oldheight = sector->floorplane.fD();
		oldtexz = sector->GetPlaneTexZ(sector_t::floor);
	}
	else
	{
		oldheight = sector->ceilingplane.fD();
		oldtexz = sector->GetPlaneTexZ(sector_t::ceiling);
	}
}